

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void __thiscall AnalogConsumer::~AnalogConsumer(AnalogConsumer *this)

{
  pointer piVar1;
  pointer puVar2;
  pointer psVar3;
  
  (this->super_HFSubConsumer).super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__AnalogConsumer_002e7288;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->args).dataRequested);
  piVar1 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->args).indices.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  puVar2 = (this->temp_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->temp_buffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  psVar3 = (this->prev_interleaved).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar3 != (pointer)0x0) {
    operator_delete(psVar3,(long)(this->prev_interleaved).
                                 super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)psVar3);
  }
  puVar2 = (this->il_id_masks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->il_id_masks).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  HFSubConsumer::~HFSubConsumer(&this->super_HFSubConsumer);
  return;
}

Assistant:

AnalogConsumer::~AnalogConsumer(){

}